

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

void __thiscall expr_tree::simplify(expr_tree *this,expr_node *node)

{
  bool bVar1;
  expr_tree *in_RSI;
  expr_node *in_RDI;
  expr_tree *unaff_retaddr;
  expr_node *in_stack_00000008;
  expr_tree *in_stack_00000010;
  expr_node *in_stack_ffffffffffffffd8;
  expr_node *node_00;
  
  if (*(char *)&in_RSI->root_ == '\x05') {
    node_00 = in_RDI;
    if ((in_RSI->parameters_).size_ != 0) {
      simplify(in_RSI,in_RDI);
    }
    if ((in_RSI->parameters_).capacity_ != 0) {
      simplify(in_RSI,in_RDI);
    }
    bVar1 = IsCalculable(in_stack_ffffffffffffffd8);
    if (bVar1) {
      calcSimplifs(in_RSI,in_RDI);
    }
    else {
      switch((in_RSI->parameters_).DEFAULT_CAPACITY) {
      case 1:
        addSimplifs(in_stack_00000010,in_stack_00000008);
        break;
      case 2:
        subSimplifs(unaff_retaddr,node_00);
        break;
      case 3:
        mulSimplifs(this,node);
        break;
      case 4:
        divSimplifs(in_stack_00000010,in_stack_00000008);
        break;
      case 5:
        pwrSimplifs(unaff_retaddr,node_00);
      }
    }
  }
  return;
}

Assistant:

void expr_tree::simplify(expr_node* node)
{
    if (node->type != OP)
        return;
    if (node->left)
        simplify(node->left);
    if (node->right)
        simplify(node->right);
    if (IsCalculable(node)) {
        calcSimplifs(node);
        return;
    }
    switch (node->value.integer) {
    case ADD:
        addSimplifs(node);
        break;
    case SUB:
        subSimplifs(node);
        break;
    case MUL:
        mulSimplifs(node);
        break;
    case DIV:
        divSimplifs(node);
        break;
    case PWR:
        pwrSimplifs(node);
        break;
    default:
        break;
    }
}